

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O2

void initialize_iterative_algorithm_parameters
               (Iterative_Method_parameters *parameters,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  code *pcVar3;
  
  parameters->implementation = Implementation_Native;
  parameters->preconditioner_type = Precond_Jacobi;
  parameters->method = Iterative_method_BiCGSTAB;
  parameters->relaxation_constant = 1.55;
  parameters->accuracy = 1e-08;
  if (argc < 2) {
    return;
  }
  iVar2 = strncasecmp(argv[1],"Null",4);
  if (iVar2 == 0) {
    parameters->preconditioner_type = Precond_Null;
  }
  if (argc == 2) {
    return;
  }
  parameters->implementation = Implementation_Laspack;
  pcVar1 = argv[1];
  iVar2 = strncasecmp(pcVar1,"Jacobi",6);
  if (iVar2 == 0) {
    pcVar3 = JacobiPrecond;
  }
  else {
    iVar2 = strncasecmp(pcVar1,"SSOR",4);
    if (iVar2 == 0) {
      pcVar3 = SSORPrecond;
    }
    else {
      pcVar3 = (PrecondProcType)0x0;
    }
  }
  parameters->preconditioner_type_laspack = pcVar3;
  pcVar1 = argv[2];
  iVar2 = strncasecmp(pcVar1,"CGN",3);
  if (iVar2 != 0) {
    iVar2 = strncasecmp(pcVar1,"BiCGStab",8);
    if (iVar2 == 0) {
      pcVar3 = BiCGSTABIter;
      goto LAB_00103526;
    }
    iVar2 = strncasecmp(pcVar1,"CGS",3);
    if (iVar2 == 0) {
      pcVar3 = CGSIter;
      goto LAB_00103526;
    }
    iVar2 = strncasecmp(pcVar1,"QMR",3);
    if (iVar2 == 0) {
      pcVar3 = QMRIter;
      goto LAB_00103526;
    }
    iVar2 = strncasecmp(pcVar1,"GMRES",5);
    if (iVar2 == 0) {
      pcVar3 = GMRESIter;
      goto LAB_00103526;
    }
  }
  pcVar3 = CGNIter;
LAB_00103526:
  parameters->method_laspack = pcVar3;
  return;
}

Assistant:

void initialize_iterative_algorithm_parameters (Iterative_Method_parameters * parameters, int argc, char ** argv) {

  parameters->implementation = Implementation_Native;
  parameters->preconditioner_type = Precond_Jacobi;
  parameters->method = Iterative_method_BiCGSTAB;
  parameters->relaxation_constant = 1.55;
  parameters->accuracy = 1e-8;

  if (argc > 1) {
    if (strncasecmp (argv[1], "Null", 4) == 0) {
      parameters->preconditioner_type = Precond_Null;
    }
  }

#ifndef NO_LASPACK
  if (argc > 2) {
    parameters->implementation = Implementation_Laspack;
    if (strncasecmp (argv[1], "Jacobi", 6) == 0) {
      parameters->preconditioner_type_laspack = JacobiPrecond;
    } else if (strncasecmp (argv[1], "SSOR", 4) == 0) {
      parameters->preconditioner_type_laspack = SSORPrecond;
    } else if (strncasecmp (argv[1], "NULL", 4) == 0) {
      parameters->preconditioner_type_laspack = NULL;
    } else {
      // default value
      parameters->preconditioner_type_laspack = NULL;
    }

    if (strncasecmp (argv[2], "CGN", 3) == 0) {
      parameters->method_laspack = CGNIter;
    } else if (strncasecmp (argv[2], "BiCGStab", 8) == 0) {
      parameters->method_laspack = BiCGSTABIter;
    } else if (strncasecmp (argv[2], "CGS", 3) == 0) {
      parameters->method_laspack = CGSIter;
    } else if (strncasecmp (argv[2], "QMR", 3) == 0) {
      parameters->method_laspack = QMRIter;
    } else if (strncasecmp (argv[2], "GMRES", 5) == 0) {
      parameters->method_laspack = GMRESIter;
    } else {
      // default value
      parameters->method_laspack = CGNIter;
    }
  }
#else
  (void) argc;
  (void) argv;
#endif /* NO_LASPACK */
}